

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Totals * __thiscall Catch::RunContext::runTest(RunContext *this,TestCase *testCase)

{
  undefined1 uVar1;
  undefined1 uVar2;
  uint uVar3;
  string *_stdOut;
  IContext *pIVar4;
  IStreamingReporter *pIVar5;
  TestCase *in_RDX;
  TestCaseStats *in_RSI;
  TestCaseInfo *in_RDI;
  TestCaseInfo testInfo;
  string redirectedCerr;
  string redirectedCout;
  Totals prevTotals;
  string *in_stack_00000460;
  string *in_stack_00000468;
  RunContext *in_stack_00000470;
  string *in_stack_fffffffffffffc08;
  undefined7 in_stack_fffffffffffffc10;
  undefined1 in_stack_fffffffffffffc17;
  TestCaseTracker *in_stack_fffffffffffffc18;
  undefined5 in_stack_fffffffffffffc20;
  byte in_stack_fffffffffffffc25;
  undefined1 in_stack_fffffffffffffc26;
  byte bVar6;
  undefined1 in_stack_fffffffffffffc27;
  undefined1 _aborting;
  undefined5 in_stack_fffffffffffffc30;
  byte in_stack_fffffffffffffc35;
  byte bVar7;
  TestCaseInfo *other;
  undefined1 local_3a8 [528];
  undefined1 local_198 [272];
  string local_88 [32];
  string local_68 [32];
  size_type local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  _Base_ptr p_Stack_30;
  undefined8 local_28;
  size_type sStack_20;
  TestCase *local_10;
  
  local_48 = (in_RSI->stdErr).field_2._M_allocated_capacity;
  uStack_40 = *(undefined8 *)((long)&(in_RSI->stdErr).field_2 + 8);
  local_38 = *(undefined8 *)&in_RSI->aborting;
  p_Stack_30 = (_Base_ptr)in_RSI[1]._vptr_TestCaseStats;
  local_28 = *(undefined8 *)&in_RSI[1].testInfo.name;
  sStack_20 = in_RSI[1].testInfo.name._M_string_length;
  other = in_RDI;
  local_10 = in_RDX;
  std::__cxx11::string::string(local_68);
  std::__cxx11::string::string(local_88);
  TestCase::getTestCaseInfo(local_10);
  TestCaseInfo::TestCaseInfo((TestCaseInfo *)in_RSI,other);
  _stdOut = (string *)
            Ptr<Catch::IStreamingReporter>::operator->
                      ((Ptr<Catch::IStreamingReporter> *)
                       &in_RSI[1].testInfo.name.field_2._M_allocated_capacity);
  (**(code **)((long)*(IShared *)_stdOut + 0x40))(_stdOut,local_198);
  (in_RSI->testInfo).className.field_2._M_allocated_capacity = (size_type)local_10;
  SectionTracking::TestCaseTracker::TestCaseTracker
            ((TestCaseTracker *)CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10),
             in_stack_fffffffffffffc08);
  Option<Catch::SectionTracking::TestCaseTracker>::operator=
            ((Option<Catch::SectionTracking::TestCaseTracker> *)
             CONCAT17(in_stack_fffffffffffffc27,
                      CONCAT16(in_stack_fffffffffffffc26,
                               CONCAT15(in_stack_fffffffffffffc25,in_stack_fffffffffffffc20))),
             in_stack_fffffffffffffc18);
  SectionTracking::TestCaseTracker::~TestCaseTracker((TestCaseTracker *)0x25a911);
  do {
    do {
      runCurrentTest(in_stack_00000470,in_stack_00000468,in_stack_00000460);
      Option<Catch::SectionTracking::TestCaseTracker>::operator->
                ((Option<Catch::SectionTracking::TestCaseTracker> *)
                 ((long)&(in_RSI->testInfo).className.field_2 + 8));
      uVar1 = SectionTracking::TestCaseTracker::isCompleted((TestCaseTracker *)0x25a947);
      bVar7 = 0;
      if (!(bool)uVar1) {
        in_stack_fffffffffffffc35 = (**(code **)(*(long *)&in_RSI->_vptr_TestCaseStats + 0x50))();
        bVar7 = in_stack_fffffffffffffc35 ^ 0xff;
      }
    } while ((bVar7 & 1) != 0);
    pIVar4 = getCurrentContext();
    uVar3 = (*pIVar4->_vptr_IContext[5])();
    _aborting = (undefined1)((ulong)pIVar4 >> 0x38);
    uVar2 = (undefined1)uVar3;
    bVar6 = 0;
    if ((uVar3 & 1) != 0) {
      in_stack_fffffffffffffc25 = (**(code **)(*(long *)&in_RSI->_vptr_TestCaseStats + 0x50))();
      bVar6 = in_stack_fffffffffffffc25 ^ 0xff;
    }
  } while ((bVar6 & 1) != 0);
  Totals::delta((Totals *)
                CONCAT17(uVar2,CONCAT16(bVar6,CONCAT15(in_stack_fffffffffffffc25,
                                                       in_stack_fffffffffffffc20))),
                (Totals *)in_stack_fffffffffffffc18);
  Counts::operator+=((Counts *)(in_RSI + 1),(Counts *)((long)&(in_RDI->name).field_2 + 8));
  pIVar5 = Ptr<Catch::IStreamingReporter>::operator->
                     ((Ptr<Catch::IStreamingReporter> *)
                      &in_RSI[1].testInfo.name.field_2._M_allocated_capacity);
  uVar2 = (**(code **)(*(long *)&in_RSI->_vptr_TestCaseStats + 0x50))();
  TestCaseStats::TestCaseStats
            (in_RSI,other,(Totals *)in_RDI,_stdOut,
             (string *)
             CONCAT17(uVar1,CONCAT16(bVar7,CONCAT15(in_stack_fffffffffffffc35,
                                                    in_stack_fffffffffffffc30))),(bool)_aborting);
  (*(pIVar5->super_IShared).super_NonCopyable._vptr_NonCopyable[0xd])(pIVar5,local_3a8);
  TestCaseStats::~TestCaseStats((TestCaseStats *)CONCAT17(uVar2,in_stack_fffffffffffffc10));
  (in_RSI->testInfo).className.field_2._M_allocated_capacity = 0;
  Option<Catch::SectionTracking::TestCaseTracker>::reset
            ((Option<Catch::SectionTracking::TestCaseTracker> *)
             CONCAT17(uVar2,in_stack_fffffffffffffc10));
  TestCaseInfo::~TestCaseInfo((TestCaseInfo *)CONCAT17(uVar2,in_stack_fffffffffffffc10));
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_68);
  return (Totals *)other;
}

Assistant:

Totals runTest( TestCase const& testCase ) {
            Totals prevTotals = m_totals;

            std::string redirectedCout;
            std::string redirectedCerr;

            TestCaseInfo testInfo = testCase.getTestCaseInfo();

            m_reporter->testCaseStarting( testInfo );

            m_activeTestCase = &testCase;
            m_testCaseTracker = TestCaseTracker( testInfo.name );

            do {
                do {
                    runCurrentTest( redirectedCout, redirectedCerr );
                }
                while( !m_testCaseTracker->isCompleted() && !aborting() );
            }
            while( getCurrentContext().advanceGeneratorsForCurrentTest() && !aborting() );

            Totals deltaTotals = m_totals.delta( prevTotals );
            m_totals.testCases += deltaTotals.testCases;
            m_reporter->testCaseEnded( TestCaseStats(   testInfo,
                                                        deltaTotals,
                                                        redirectedCout,
                                                        redirectedCerr,
                                                        aborting() ) );

            m_activeTestCase = NULL;
            m_testCaseTracker.reset();

            return deltaTotals;
        }